

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumVal.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  AttTypes AVar5;
  DTDValidator *this;
  SAXParser *this_00;
  XMLCh *pXVar6;
  ulong uVar7;
  ulong uVar8;
  ostream *poVar9;
  AttTypes type;
  XMLAttDef *local_d0;
  XMLAttDef *curAttDef;
  long *plStack_c0;
  uint i;
  XMLAttDefList *attList;
  StrX local_b0;
  XMLElementDecl *local_a8;
  DTDElementDecl *curElem;
  NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> elemEnum;
  DTDGrammar *grammar;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  int errorCode;
  SAXParser *parser;
  DTDValidator *valToUse;
  int errorCount;
  ValSchemes valScheme;
  char *xmlFile;
  XMLException *toCatch;
  char **argV_local;
  int argC_local;
  
  uVar7 = 0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argC < 2) {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    argV_local._4_4_ = 1;
  }
  else if ((argC == 2) && (*argV[1] != '-')) {
    pcVar1 = argV[1];
    this = (DTDValidator *)xercesc_4_0::XMemory::operator_new((XMemory *)0x30,uVar7);
    uVar7 = 0;
    xercesc_4_0::DTDValidator::DTDValidator(this,(XMLErrorReporter *)0x0);
    this_00 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,uVar7);
    xercesc_4_0::SAXParser::SAXParser
              (this_00,(XMLValidator *)this,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
               (XMLGrammarPool *)0x0);
    xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this_00);
    (**(code **)(*(long *)this_00 + 0x40))(this_00,pcVar1);
    iVar4 = xercesc_4_0::SAXParser::getErrorCount();
    if (iVar4 == 0) {
      elemEnum.fMemoryManager = (MemoryManager *)(**(code **)(*(long *)this + 0x50))();
      xercesc_4_0::DTDGrammar::getElemEnumerator
                ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)&curElem,
                 (DTDGrammar *)elemEnum.fMemoryManager);
      bVar2 = xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::hasMoreElements
                        ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)&curElem);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"\nELEMENTS:\n----------------------------\n");
        while (bVar2 = xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::
                       hasMoreElements((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)&curElem
                                      ), bVar2) {
          local_a8 = (XMLElementDecl *)
                     xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::nextElement
                               ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)&curElem);
          poVar9 = std::operator<<((ostream *)&std::cout,"  Name: ");
          pXVar6 = xercesc_4_0::XMLElementDecl::getFullName(local_a8);
          StrX::StrX(&local_b0,pXVar6);
          poVar9 = operator<<(poVar9,&local_b0);
          std::operator<<(poVar9,"\n");
          StrX::~StrX(&local_b0);
          poVar9 = std::operator<<((ostream *)&std::cout,"  Content Model: ");
          pXVar6 = (XMLCh *)(**(code **)(*(long *)local_a8 + 0x68))();
          StrX::StrX((StrX *)&attList,pXVar6);
          poVar9 = operator<<(poVar9,(StrX *)&attList);
          std::operator<<(poVar9,"\n");
          StrX::~StrX((StrX *)&attList);
          bVar3 = (**(code **)(*(long *)local_a8 + 0x38))();
          if ((bVar3 & 1) != 0) {
            std::operator<<((ostream *)&std::cout,"  Attributes:\n");
            plStack_c0 = (long *)(**(code **)(*(long *)local_a8 + 0x28))();
            for (curAttDef._4_4_ = 0; uVar7 = (ulong)curAttDef._4_4_,
                uVar8 = (**(code **)(*plStack_c0 + 0x50))(), uVar7 < uVar8;
                curAttDef._4_4_ = curAttDef._4_4_ + 1) {
              local_d0 = (XMLAttDef *)(**(code **)(*plStack_c0 + 0x58))(plStack_c0,curAttDef._4_4_);
              poVar9 = std::operator<<((ostream *)&std::cout,"    Name:");
              pXVar6 = (XMLCh *)(**(code **)(*(long *)local_d0 + 0x28))();
              StrX::StrX((StrX *)&stack0xffffffffffffff28,pXVar6);
              poVar9 = operator<<(poVar9,(StrX *)&stack0xffffffffffffff28);
              std::operator<<(poVar9,", Type: ");
              StrX::~StrX((StrX *)&stack0xffffffffffffff28);
              AVar5 = xercesc_4_0::XMLAttDef::getType(local_d0);
              switch(AVar5) {
              case AttTypes_Min:
                std::operator<<((ostream *)&std::cout,"CDATA");
                break;
              case ID:
                std::operator<<((ostream *)&std::cout,"ID");
                break;
              case IDRef:
              case IDRefs:
                std::operator<<((ostream *)&std::cout,"IDREF(S)");
                break;
              case Entity:
              case Entities:
                std::operator<<((ostream *)&std::cout,"ENTITY(IES)");
                break;
              case NmToken:
              case NmTokens:
                std::operator<<((ostream *)&std::cout,"NMTOKEN(S)");
                break;
              case Notation:
                std::operator<<((ostream *)&std::cout,"NOTATION");
                break;
              case Enumeration:
                std::operator<<((ostream *)&std::cout,"ENUMERATION");
              }
              std::operator<<((ostream *)&std::cout,"\n");
            }
          }
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"The validator has no elements to display\n")
        ;
        std::ostream::operator<<((ostream *)poVar9,std::endl<char,std::char_traits<char>>);
      }
      xercesc_4_0::NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl>::~NameIdPoolEnumerator
                ((NameIdPoolEnumerator<xercesc_4_0::DTDElementDecl> *)&curElem);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"\nErrors occurred, no output available\n");
      std::ostream::operator<<((ostream *)poVar9,std::endl<char,std::char_traits<char>>);
    }
    if (this_00 != (SAXParser *)0x0) {
      (**(code **)(*(long *)this_00 + 8))();
    }
    xercesc_4_0::XMLPlatformUtils::Terminate();
    if (iVar4 < 1) {
      argV_local._4_4_ = 0;
    }
    else {
      argV_local._4_4_ = 4;
    }
  }
  else {
    usage();
    xercesc_4_0::XMLPlatformUtils::Terminate();
    argV_local._4_4_ = 1;
  }
  return argV_local._4_4_;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C system
    try
    {
         XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
         std::cerr   << "Error during initialization! Message:\n"
                << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // We only have one required parameter, which is the file to process
    if ((argC != 2) || (*(argV[1]) == '-'))
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    const char*              xmlFile   = argV[1];
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;

    //
    //  Create a DTD validator to be used for our validation work. Then create
    //  a SAX parser object and pass it our validator. Then, according to what
    //  we were told on the command line, set it to validate or not. He owns
    //  the validator, so we have to allocate it.
    //
    int errorCount = 0;
    DTDValidator* valToUse = new DTDValidator;
    SAXParser* parser = new SAXParser(valToUse);
    parser->setValidationScheme(valScheme);

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    int errorCode = 0;
    try
    {
        parser->parse(xmlFile);
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    if (!errorCount) {
        //
        //  Now we will get an enumerator for the element pool from the validator
        //  and enumerate the elements, printing them as we go. For each element
        //  we get an enumerator for its attributes and print them also.
        //
        DTDGrammar* grammar = (DTDGrammar*) valToUse->getGrammar();
        NameIdPoolEnumerator<DTDElementDecl> elemEnum = grammar->getElemEnumerator();
        if (elemEnum.hasMoreElements())
        {
            std::cout << "\nELEMENTS:\n----------------------------\n";
            while(elemEnum.hasMoreElements())
            {
                const DTDElementDecl& curElem = elemEnum.nextElement();
                std::cout << "  Name: " << StrX(curElem.getFullName()) << "\n";

                std::cout << "  Content Model: "
                     << StrX(curElem.getFormattedContentModel())
                     << "\n";

                // Get an enumerator for this guy's attributes if any
                if (curElem.hasAttDefs())
                {
                    std::cout << "  Attributes:\n";
                    XMLAttDefList& attList = curElem.getAttDefList();
                    for (unsigned int i=0; i<attList.getAttDefCount(); i++)
                    {
                        const XMLAttDef& curAttDef = attList.getAttDef(i);
                        std::cout << "    Name:" << StrX(curAttDef.getFullName())
                             << ", Type: ";

                        // Get the type and display it
                        const XMLAttDef::AttTypes type = curAttDef.getType();
                        switch(type)
                        {
                            case XMLAttDef::CData :
                                std::cout << "CDATA";
                                break;

                            case XMLAttDef::ID :
                                std::cout << "ID";
                                break;

                            case XMLAttDef::IDRef :
                            case XMLAttDef::IDRefs :
                                std::cout << "IDREF(S)";
                                break;

                            case XMLAttDef::Entity :
                            case XMLAttDef::Entities :
                                std::cout << "ENTITY(IES)";
                                break;

                            case XMLAttDef::NmToken :
                            case XMLAttDef::NmTokens :
                                std::cout << "NMTOKEN(S)";
                                break;

                            case XMLAttDef::Notation :
                                std::cout << "NOTATION";
                                break;

                            case XMLAttDef::Enumeration :
                                std::cout << "ENUMERATION";
                                break;
                            default:
                                break;
                        }

                        std::cout << "\n";
                    }
                }
                std::cout << std::endl;
            }
        }
         else
        {
            std::cout << "The validator has no elements to display\n" << std::endl;
        }
    }
    else
        std::cout << "\nErrors occurred, no output available\n" << std::endl;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}